

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O2

Ref<glTF::Accessor>
ExportData(Asset *a,string *meshName,Ref<glTF::Buffer> *buffer,uint count,void *data,Value typeIn,
          Value typeOut,ComponentType compType,bool isIndices)

{
  LazyDict<glTF::BufferView> *this;
  LazyDict<glTF::Accessor> *this_00;
  int iVar1;
  Buffer *this_01;
  BufferView *pBVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  vector<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_> *pvVar7;
  vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *pvVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  float *pfVar13;
  Accessor *pAVar14;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  float fVar18;
  Ref<glTF::BufferView> RVar19;
  Ref<glTF::Accessor> RVar20;
  float float_MAX;
  value_type_conflict3 local_74;
  Asset *local_70;
  string local_68;
  ulong local_48;
  ulong local_40;
  Ref<glTF::Buffer> *local_38;
  
  if (data == (void *)0x0 || count == 0) {
    pvVar8 = (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0;
    uVar10 = 0;
  }
  else {
    iVar1 = *(int *)(&DAT_0071be58 + (ulong)typeIn * 0x10);
    uVar15 = *(uint *)(&DAT_0071be58 + (ulong)typeOut * 0x10);
    uVar10 = (ulong)uVar15;
    local_70 = a;
    uVar6 = glTF::ComponentTypeSize(compType);
    local_48 = CONCAT44(0,uVar6);
    this_01 = (buffer->vector->super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>).
              _M_impl.super__Vector_impl_data._M_start[buffer->index];
    local_40 = this_01->byteLength;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_48;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_40;
    uVar9 = (ulong)(count * uVar6 * uVar15);
    local_38 = buffer;
    glTF::Buffer::Grow(this_01,SUB168(auVar5 % auVar4,0) + uVar9);
    this = &local_70->bufferViews;
    glTF::Asset::FindUniqueID(&local_68,local_70,meshName,"view");
    RVar19 = glTF::LazyDict<glTF::BufferView>::Create
                       (this,(char *)CONCAT44(local_68._M_dataplus._M_p._4_4_,
                                              local_68._M_dataplus._M_p._0_4_));
    pvVar7 = RVar19.vector;
    uVar6 = RVar19.index;
    uVar16 = SUB164(auVar5 % auVar4,0) + (int)local_40;
    std::__cxx11::string::~string((string *)&local_68);
    pBVar2 = (pvVar7->super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>).
             _M_impl.super__Vector_impl_data._M_start[uVar6];
    (pBVar2->buffer).index = local_38->index;
    (pBVar2->buffer).vector = local_38->vector;
    (pvVar7->super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar6]->byteOffset = (ulong)uVar16;
    (pvVar7->super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar6]->byteLength = uVar9;
    (pvVar7->super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar6]->target = isIndices | BufferViewTarget_ARRAY_BUFFER;
    this_00 = &local_70->accessors;
    glTF::Asset::FindUniqueID(&local_68,local_70,meshName,"accessor");
    RVar20 = glTF::LazyDict<glTF::Accessor>::Create
                       (this_00,(char *)CONCAT44(local_68._M_dataplus._M_p._4_4_,
                                                 local_68._M_dataplus._M_p._0_4_));
    pvVar8 = RVar20.vector;
    uVar16 = RVar20.index;
    std::__cxx11::string::~string((string *)&local_68);
    pAVar14 = (pvVar8->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
              _M_impl.super__Vector_impl_data._M_start[uVar16];
    (pAVar14->bufferView).vector = pvVar7;
    (pAVar14->bufferView).index = uVar6;
    (pvVar8->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar16]->byteOffset = 0;
    (pvVar8->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar16]->byteStride = 0;
    (pvVar8->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar16]->componentType = compType;
    (pvVar8->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar16]->count = count;
    (pvVar8->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar16]->type = typeOut;
    local_68._M_dataplus._M_p._0_4_ = 1e+13;
    while (bVar17 = uVar15 != 0, uVar15 = uVar15 - 1, bVar17) {
      std::vector<float,_std::allocator<float>_>::push_back
                (&(pvVar8->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[uVar16]->min,
                 (value_type_conflict3 *)&local_68);
      local_74 = -local_68._M_dataplus._M_p._0_4_;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>
                (&(pvVar8->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[uVar16]->max,&local_74);
    }
    for (uVar9 = 0; uVar9 != count; uVar9 = uVar9 + 1) {
      lVar11 = uVar9 * 0xc;
      for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
        if (typeOut == SCALAR) {
          fVar18 = (float)*(ushort *)((long)data + uVar9 * 2);
        }
        else {
          pfVar13 = (float *)((long)data + lVar11 + 8);
          if (((int)uVar12 != 2) && (pfVar13 = (float *)((long)data + lVar11), (int)uVar12 == 1)) {
            pfVar13 = (float *)((long)data + lVar11 + 4);
          }
          fVar18 = *pfVar13;
        }
        pAVar14 = (pvVar8->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[uVar16];
        lVar3 = *(long *)&(pAVar14->min).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data;
        if (fVar18 < *(float *)(lVar3 + uVar12 * 4)) {
          *(float *)(lVar3 + uVar12 * 4) = fVar18;
          pAVar14 = (pvVar8->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar16];
        }
        lVar3 = *(long *)&(pAVar14->max).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data;
        pfVar13 = (float *)(lVar3 + uVar12 * 4);
        if (*pfVar13 <= fVar18 && fVar18 != *pfVar13) {
          *(float *)(lVar3 + uVar12 * 4) = fVar18;
        }
      }
    }
    glTF::Accessor::WriteData
              ((pvVar8->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar16],(ulong)count,data,
               (ulong)(uint)((int)local_48 * iVar1));
    uVar10 = (ulong)uVar16;
  }
  RVar20._8_8_ = uVar10;
  RVar20.vector = pvVar8;
  return RVar20;
}

Assistant:

inline Ref<Accessor> ExportData(Asset& a, std::string& meshName, Ref<Buffer>& buffer,
    unsigned int count, void* data, AttribType::Value typeIn, AttribType::Value typeOut, ComponentType compType, bool isIndices = false)
{
    if (!count || !data) return Ref<Accessor>();

    unsigned int numCompsIn = AttribType::GetNumComponents(typeIn);
    unsigned int numCompsOut = AttribType::GetNumComponents(typeOut);
    unsigned int bytesPerComp = ComponentTypeSize(compType);

    size_t offset = buffer->byteLength;
    // make sure offset is correctly byte-aligned, as required by spec
    size_t padding = offset % bytesPerComp;
    offset += padding;
    size_t length = count * numCompsOut * bytesPerComp;
    buffer->Grow(length + padding);

    // bufferView
    Ref<BufferView> bv = a.bufferViews.Create(a.FindUniqueID(meshName, "view"));
    bv->buffer = buffer;
    bv->byteOffset = unsigned(offset);
    bv->byteLength = length; //! The target that the WebGL buffer should be bound to.
    bv->target = isIndices ? BufferViewTarget_ELEMENT_ARRAY_BUFFER : BufferViewTarget_ARRAY_BUFFER;

    // accessor
    Ref<Accessor> acc = a.accessors.Create(a.FindUniqueID(meshName, "accessor"));
    acc->bufferView = bv;
    acc->byteOffset = 0;
    acc->byteStride = 0;
    acc->componentType = compType;
    acc->count = count;
    acc->type = typeOut;

    // calculate min and max values
    {
        // Allocate and initialize with large values.
        float float_MAX = 10000000000000.0f;
        for (unsigned int i = 0 ; i < numCompsOut ; i++) {
            acc->min.push_back( float_MAX);
            acc->max.push_back(-float_MAX);
        }

        // Search and set extreme values.
        float valueTmp;
        for (unsigned int i = 0 ; i < count       ; i++) {
            for (unsigned int j = 0 ; j < numCompsOut ; j++) {
                if (numCompsOut == 1) {
                  valueTmp = static_cast<unsigned short*>(data)[i];
                } else {
                  valueTmp = static_cast<aiVector3D*>(data)[i][j];
                }

                if (valueTmp < acc->min[j]) {
                    acc->min[j] = valueTmp;
                }
                if (valueTmp > acc->max[j]) {
                    acc->max[j] = valueTmp;
                }
            }
        }
    }

    // copy the data
    acc->WriteData(count, data, numCompsIn*bytesPerComp);

    return acc;
}